

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::RepeatedEnumFieldGenerator::GenerateMergingCodeFromPacked
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  RepeatedEnumFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "int bytes = input.readRawVarint32();\nint limit = input.pushLimit(bytes);\n// First pass to compute array length.\nint arrayLength = 0;\nint startPos = input.getPosition();\nwhile (input.getBytesUntilLimit() > 0) {\n  switch (input.readInt32()) {\n"
                    );
  io::Printer::Indent(printer);
  anon_unknown_3::PrintCaseLabels(printer,&this->canonical_values_);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,&this->variables_,
                     "      arrayLength++;\n      break;\n  }\n}\nif (arrayLength != 0) {\n  input.rewindToPosition(startPos);\n  int i = this.$name$ == null ? 0 : this.$name$.length;\n  int[] newArray = new int[i + arrayLength];\n  if (i != 0) {\n    java.lang.System.arraycopy(this.$name$, 0, newArray, 0, i);\n  }\n  while (input.getBytesUntilLimit() > 0) {\n    int value = input.readInt32();\n    switch (value) {\n"
                    );
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  anon_unknown_3::PrintCaseLabels(printer,&this->canonical_values_);
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,&this->variables_,
                     "        newArray[i++] = value;\n        break;\n    }\n  }\n  this.$name$ = newArray;\n}\ninput.popLimit(limit);\n"
                    );
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateMergingCodeFromPacked(io::Printer* printer) const {
  printer->Print(variables_,
    "int bytes = input.readRawVarint32();\n"
    "int limit = input.pushLimit(bytes);\n"
    "// First pass to compute array length.\n"
    "int arrayLength = 0;\n"
    "int startPos = input.getPosition();\n"
    "while (input.getBytesUntilLimit() > 0) {\n"
    "  switch (input.readInt32()) {\n");
  printer->Indent();
  PrintCaseLabels(printer, canonical_values_);
  printer->Outdent();
  printer->Print(variables_,
    "      arrayLength++;\n"
    "      break;\n"
    "  }\n"
    "}\n"
    "if (arrayLength != 0) {\n"
    "  input.rewindToPosition(startPos);\n"
    "  int i = this.$name$ == null ? 0 : this.$name$.length;\n"
    "  int[] newArray = new int[i + arrayLength];\n"
    "  if (i != 0) {\n"
    "    java.lang.System.arraycopy(this.$name$, 0, newArray, 0, i);\n"
    "  }\n"
    "  while (input.getBytesUntilLimit() > 0) {\n"
    "    int value = input.readInt32();\n"
    "    switch (value) {\n");
  printer->Indent();
  printer->Indent();
  PrintCaseLabels(printer, canonical_values_);
  printer->Outdent();
  printer->Outdent();
  printer->Print(variables_,
    "        newArray[i++] = value;\n"
    "        break;\n"
    "    }\n"
    "  }\n"
    "  this.$name$ = newArray;\n"
    "}\n"
    "input.popLimit(limit);\n");
}